

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall
Camera::Camera(Camera *this,Vec3 *origin,Vec3 *lower_left_corner,Vec3 *horizontal,Vec3 *vertical)

{
  long in_RDI;
  Vec3 *in_stack_ffffffffffffff88;
  Vec3 *in_stack_ffffffffffffff90;
  
  Vec3::Vec3(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Vec3::Vec3(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Vec3::Vec3(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Vec3::Vec3(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Vec3::Vec3((Vec3 *)(in_RDI + 0x30));
  Vec3::Vec3((Vec3 *)(in_RDI + 0x3c));
  Vec3::Vec3((Vec3 *)(in_RDI + 0x48));
  return;
}

Assistant:

Camera::Camera(const Vec3& origin, const Vec3& lower_left_corner,const Vec3& horizontal,const Vec3& vertical)
: m_origin(origin), m_lower_left_corner(lower_left_corner), m_horizontal(horizontal), m_vertical(vertical)
{

}